

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

ostream * operator<<(ostream *stream,Path *p)

{
  ostream *poVar1;
  string local_38 [32];
  Path *local_18;
  Path *p_local;
  ostream *stream_local;
  
  local_18 = p;
  p_local = (Path *)stream;
  Pathie::Path::str_abi_cxx11_((Path *)local_38);
  poVar1 = std::operator<<(stream,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const Path& p)
{
  return stream << p.str();
}